

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_4::FunctionScopedInstructions
          (ValidationState_t *_,Instruction *inst,Op opcode)

{
  Instruction *this;
  bool bVar1;
  ModuleLayoutSection MVar2;
  uint function_type_id;
  uint32_t uVar3;
  uint32_t uVar4;
  spv_result_t sVar5;
  Function *pFVar6;
  size_t sVar7;
  spv_ext_inst_type_t *psVar8;
  DiagnosticStream *pDVar9;
  char *local_1df8;
  DiagnosticStream local_1df0;
  char *local_1c18;
  DiagnosticStream local_1c10;
  DiagnosticStream local_1a38;
  char *local_1860;
  DiagnosticStream local_1858;
  DiagnosticStream local_1680;
  DiagnosticStream local_14a8;
  DiagnosticStream local_12d0;
  DiagnosticStream local_10f8;
  OpenCLDebugInfo100Instructions local_f1c;
  OpenCLDebugInfo100Instructions local_f18;
  DebugInfoInstructions ext_inst_key_2;
  NonSemanticShaderDebugInfo100Instructions ext_inst_key_1;
  OpenCLDebugInfo100Instructions ext_inst_key;
  undefined1 local_f08 [3];
  bool local_debug_info;
  uint32_t ext_inst_index;
  DiagnosticStream local_d30;
  undefined4 local_b54;
  spv_result_t error_5;
  spv_result_t error_4;
  DiagnosticStream local_978;
  DiagnosticStream local_7a0;
  undefined1 local_5c0 [4];
  spv_result_t error_3;
  DiagnosticStream local_3e8;
  spv_result_t local_208;
  spv_result_t error_2;
  spv_result_t error_1;
  FunctionControlMask control_mask;
  undefined4 local_28;
  Op local_24;
  spv_result_t error;
  Op opcode_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_24 = opcode;
  _error = inst;
  inst_local = (Instruction *)_;
  MVar2 = ValidationState_t::current_layout_section(_);
  if ((MVar2 == kLayoutFunctionDeclarations) &&
     (bVar1 = ValidationState_t::IsOpcodeInCurrentLayoutSection
                        ((ValidationState_t *)inst_local,local_24), !bVar1)) {
    ValidationState_t::ProgressToNextLayoutSectionOrder((ValidationState_t *)inst_local);
    bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
    if (bVar1) {
      pFVar6 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      sVar5 = Function::RegisterSetFunctionDeclType(pFVar6,kFunctionDeclDefinition);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      local_28 = 0;
    }
  }
  bVar1 = ValidationState_t::IsOpcodeInCurrentLayoutSection
                    ((ValidationState_t *)inst_local,local_24);
  if (!bVar1) {
    ValidationState_t::diag
              (&local_1df0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
    local_1df8 = spvOpcodeString(local_24);
    pDVar9 = DiagnosticStream::operator<<(&local_1df0,&local_1df8);
    pDVar9 = DiagnosticStream::operator<<
                       (pDVar9,(char (*) [41])" cannot appear in a function declaration");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    DiagnosticStream::~DiagnosticStream(&local_1df0);
    return __local._4_4_;
  }
  if (local_24 == OpLine) {
    return SPV_SUCCESS;
  }
  if (local_24 == OpExtInst) {
LAB_002cec74:
    psVar8 = Instruction::ext_inst_type(_error);
    bVar1 = spvExtInstIsDebugInfo(*psVar8);
    if (bVar1) {
      ext_inst_key = Instruction::word(_error,4);
      ext_inst_key_1._3_1_ = NonSemanticShaderDebugInfo100DebugInfoNone >> 0x18;
      psVar8 = Instruction::ext_inst_type(_error);
      if (*psVar8 == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
        ext_inst_key_2 = ext_inst_key;
        if ((((ext_inst_key == OpenCLDebugInfo100DebugScope) ||
             (ext_inst_key == OpenCLDebugInfo100DebugNoScope)) ||
            (ext_inst_key == OpenCLDebugInfo100DebugDeclare)) ||
           (ext_inst_key == OpenCLDebugInfo100DebugValue)) {
          ext_inst_key_1._3_1_ = 1;
        }
      }
      else {
        psVar8 = Instruction::ext_inst_type(_error);
        if (*psVar8 == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          local_f18 = ext_inst_key;
          if ((((ext_inst_key == OpenCLDebugInfo100DebugScope) ||
               (ext_inst_key == OpenCLDebugInfo100DebugNoScope)) ||
              ((ext_inst_key == OpenCLDebugInfo100DebugDeclare ||
               ((ext_inst_key == OpenCLDebugInfo100DebugValue || (ext_inst_key == 0x67)))))) ||
             ((ext_inst_key == 0x68 || (ext_inst_key == 0x65)))) {
            ext_inst_key_1._3_1_ = 1;
          }
        }
        else {
          local_f1c = ext_inst_key;
          if ((((ext_inst_key == OpenCLDebugInfo100DebugScope) ||
               (ext_inst_key == OpenCLDebugInfo100DebugNoScope)) ||
              (ext_inst_key == OpenCLDebugInfo100DebugDeclare)) ||
             (ext_inst_key == OpenCLDebugInfo100DebugValue)) {
            ext_inst_key_1._3_1_ = 1;
          }
        }
      }
      if ((ext_inst_key_1._3_1_ & 1) == NonSemanticShaderDebugInfo100DebugInfoNone >> 0x18) {
        MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local);
        if (((int)MVar2 < 0xb) ||
           (MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local),
           0xb < (int)MVar2)) {
          ValidationState_t::diag
                    (&local_12d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_12d0,
                              (char (*) [46])"Debug info extension instructions other than ");
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [52])
                                     "DebugScope, DebugNoScope, DebugDeclare, DebugValue ");
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [50])
                                     "must appear between section 9 (types, constants, ");
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [44])"global variables) and section 10 (function ");
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [14])"declarations)");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_12d0);
          return __local._4_4_;
        }
      }
      else {
        bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
        if (!bVar1) {
          ValidationState_t::diag
                    (&local_10f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_10f8,
                              (char (*) [52])"DebugScope, DebugNoScope, DebugDeclare, DebugValue ");
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [51])
                                     "of debug info extension must appear in a function ");
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [5])0x63fa85);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_10f8);
          return __local._4_4_;
        }
      }
    }
    else {
      psVar8 = Instruction::ext_inst_type(_error);
      bVar1 = spvExtInstIsNonSemantic(*psVar8);
      if (bVar1) {
        MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local);
        if ((int)MVar2 < 0xb) {
          ValidationState_t::diag
                    (&local_14a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_14a8,
                              (char (*) [53])"Non-semantic OpExtInst must not appear before types ")
          ;
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [8])0x63f963);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_14a8);
          return __local._4_4_;
        }
        bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
        if ((bVar1) &&
           (bVar1 = ValidationState_t::in_block((ValidationState_t *)inst_local), !bVar1)) {
          ValidationState_t::diag
                    (&local_1680,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_1680,
                              (char (*) [73])
                              "Non-semantic OpExtInst within function definition must appear in a block"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_1680);
          return __local._4_4_;
        }
      }
      else {
        bVar1 = ValidationState_t::in_block((ValidationState_t *)inst_local);
        if (!bVar1) {
          ValidationState_t::diag
                    (&local_1858,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
          local_1860 = spvOpcodeString(local_24);
          pDVar9 = DiagnosticStream::operator<<(&local_1858,&local_1860);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [24])0x63fb7c);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_1858);
          return __local._4_4_;
        }
      }
    }
  }
  else {
    if (local_24 == OpFunction) {
      bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
      if (bVar1) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&error_1,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_LAYOUT,_error);
        pDVar9 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&error_1,
                            (char (*) [45])"Cannot declare a function in a function body");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_1);
        return __local._4_4_;
      }
      error_2 = Instruction::GetOperandAs<spv::FunctionControlMask>(_error,2);
      this = inst_local;
      uVar3 = Instruction::id(_error);
      uVar4 = Instruction::type_id(_error);
      sVar5 = error_2;
      function_type_id = Instruction::GetOperandAs<unsigned_int>(_error,3);
      local_208 = ValidationState_t::RegisterFunction
                            ((ValidationState_t *)this,uVar3,uVar4,sVar5,function_type_id);
      if (local_208 != SPV_SUCCESS) {
        return local_208;
      }
      MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local);
      if (MVar2 != kLayoutFunctionDefinitions) {
        return SPV_SUCCESS;
      }
      pFVar6 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      sVar5 = Function::RegisterSetFunctionDeclType(pFVar6,kFunctionDeclDefinition);
    }
    else if (local_24 == OpFunctionParameter) {
      bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
      if (!bVar1) {
        ValidationState_t::diag
                  (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_3e8,
                            (char (*) [59])
                            "Function parameter instructions must be in a function body");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_3e8);
        return __local._4_4_;
      }
      pFVar6 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      sVar7 = Function::block_count(pFVar6);
      if (sVar7 != 0) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_5c0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_LAYOUT,_error);
        pDVar9 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_5c0,
                            (char (*) [79])
                            "Function parameters must only appear immediately after the function definition"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5c0);
        return __local._4_4_;
      }
      pFVar6 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      uVar3 = Instruction::id(_error);
      uVar4 = Instruction::type_id(_error);
      sVar5 = Function::RegisterFunctionParameter(pFVar6,uVar3,uVar4);
    }
    else {
      if (local_24 != OpFunctionEnd) {
        if (local_24 == OpLabel) {
          bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
          if (!bVar1) {
            ValidationState_t::diag
                      (&local_d30,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
            pDVar9 = DiagnosticStream::operator<<
                               (&local_d30,
                                (char (*) [46])"Label instructions must be in a function body");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_d30);
            return __local._4_4_;
          }
          bVar1 = ValidationState_t::in_block((ValidationState_t *)inst_local);
          if (!bVar1) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)local_f08,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_LAYOUT,_error);
          pDVar9 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_f08,
                              (char (*) [44])"A block must end with a branch instruction.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_f08);
          return __local._4_4_;
        }
        if (local_24 == OpNoLine) {
          return SPV_SUCCESS;
        }
        if (local_24 != OpExtInstWithForwardRefsKHR) {
          MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local);
          if ((MVar2 == kLayoutFunctionDeclarations) &&
             (bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local), bVar1))
          {
            ValidationState_t::diag
                      (&local_1a38,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
            pDVar9 = DiagnosticStream::operator<<
                               (&local_1a38,(char (*) [35])"A function must begin with a label");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_1a38);
            return __local._4_4_;
          }
          bVar1 = ValidationState_t::in_block((ValidationState_t *)inst_local);
          if (bVar1) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag
                    (&local_1c10,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
          local_1c18 = spvOpcodeString(local_24);
          pDVar9 = DiagnosticStream::operator<<(&local_1c10,&local_1c18);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [24])0x63fb7c);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          DiagnosticStream::~DiagnosticStream(&local_1c10);
          return __local._4_4_;
        }
        goto LAB_002cec74;
      }
      bVar1 = ValidationState_t::in_function_body((ValidationState_t *)inst_local);
      if (!bVar1) {
        ValidationState_t::diag
                  (&local_7a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_7a0,
                            (char (*) [53])"Function end instructions must be in a function body");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_7a0);
        return __local._4_4_;
      }
      bVar1 = ValidationState_t::in_block((ValidationState_t *)inst_local);
      if (bVar1) {
        ValidationState_t::diag
                  (&local_978,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_LAYOUT,_error);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_978,(char (*) [40])"Function end cannot be called in blocks");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_978);
        return __local._4_4_;
      }
      pFVar6 = ValidationState_t::current_function((ValidationState_t *)inst_local);
      sVar7 = Function::block_count(pFVar6);
      if ((sVar7 == 0) &&
         (MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local),
         MVar2 == kLayoutFunctionDefinitions)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&error_5,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_LAYOUT,_error);
        pDVar9 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&error_5,
                            (char (*) [63])
                            "Function declarations must appear before function definitions.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&error_5);
        return __local._4_4_;
      }
      MVar2 = ValidationState_t::current_layout_section((ValidationState_t *)inst_local);
      if (MVar2 == kLayoutFunctionDeclarations) {
        pFVar6 = ValidationState_t::current_function((ValidationState_t *)inst_local);
        sVar5 = Function::RegisterSetFunctionDeclType(pFVar6,kFunctionDeclDeclaration);
        if (sVar5 != SPV_SUCCESS) {
          return sVar5;
        }
        local_b54 = 0;
      }
      sVar5 = ValidationState_t::RegisterFunctionEnd((ValidationState_t *)inst_local);
    }
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t FunctionScopedInstructions(ValidationState_t& _,
                                        const Instruction* inst,
                                        spv::Op opcode) {
  // Make sure we advance into the function definitions when we hit
  // non-function declaration instructions.
  if (_.current_layout_section() == kLayoutFunctionDeclarations &&
      !_.IsOpcodeInCurrentLayoutSection(opcode)) {
    _.ProgressToNextLayoutSectionOrder();

    if (_.in_function_body()) {
      if (auto error = _.current_function().RegisterSetFunctionDeclType(
              FunctionDecl::kFunctionDeclDefinition)) {
        return error;
      }
    }
  }

  if (_.IsOpcodeInCurrentLayoutSection(opcode)) {
    switch (opcode) {
      case spv::Op::OpFunction: {
        if (_.in_function_body()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Cannot declare a function in a function body";
        }
        auto control_mask = inst->GetOperandAs<spv::FunctionControlMask>(2);
        if (auto error =
                _.RegisterFunction(inst->id(), inst->type_id(), control_mask,
                                   inst->GetOperandAs<uint32_t>(3)))
          return error;
        if (_.current_layout_section() == kLayoutFunctionDefinitions) {
          if (auto error = _.current_function().RegisterSetFunctionDeclType(
                  FunctionDecl::kFunctionDeclDefinition))
            return error;
        }
      } break;

      case spv::Op::OpFunctionParameter:
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function parameter instructions must be in a "
                    "function body";
        }
        if (_.current_function().block_count() != 0) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function parameters must only appear immediately after "
                    "the function definition";
        }
        if (auto error = _.current_function().RegisterFunctionParameter(
                inst->id(), inst->type_id()))
          return error;
        break;

      case spv::Op::OpFunctionEnd:
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function end instructions must be in a function body";
        }
        if (_.in_block()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function end cannot be called in blocks";
        }
        if (_.current_function().block_count() == 0 &&
            _.current_layout_section() == kLayoutFunctionDefinitions) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function declarations must appear before "
                    "function definitions.";
        }
        if (_.current_layout_section() == kLayoutFunctionDeclarations) {
          if (auto error = _.current_function().RegisterSetFunctionDeclType(
                  FunctionDecl::kFunctionDeclDeclaration))
            return error;
        }
        if (auto error = _.RegisterFunctionEnd()) return error;
        break;

      case spv::Op::OpLine:
      case spv::Op::OpNoLine:
        break;
      case spv::Op::OpLabel:
        // If the label is encountered then the current function is a
        // definition so set the function to a declaration and update the
        // module section
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Label instructions must be in a function body";
        }
        if (_.in_block()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "A block must end with a branch instruction.";
        }
        break;

      case spv::Op::OpExtInst:
      case spv::Op::OpExtInstWithForwardRefsKHR:
        if (spvExtInstIsDebugInfo(inst->ext_inst_type())) {
          const uint32_t ext_inst_index = inst->word(4);
          bool local_debug_info = false;
          if (inst->ext_inst_type() == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
            const OpenCLDebugInfo100Instructions ext_inst_key =
                OpenCLDebugInfo100Instructions(ext_inst_index);
            if (ext_inst_key == OpenCLDebugInfo100DebugScope ||
                ext_inst_key == OpenCLDebugInfo100DebugNoScope ||
                ext_inst_key == OpenCLDebugInfo100DebugDeclare ||
                ext_inst_key == OpenCLDebugInfo100DebugValue) {
              local_debug_info = true;
            }
          } else if (inst->ext_inst_type() ==
                     SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
            const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
                NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
            if (ext_inst_key == NonSemanticShaderDebugInfo100DebugScope ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugNoScope ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugDeclare ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugValue ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugLine ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugNoLine ||
                ext_inst_key ==
                    NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
              local_debug_info = true;
            }
          } else {
            const DebugInfoInstructions ext_inst_key =
                DebugInfoInstructions(ext_inst_index);
            if (ext_inst_key == DebugInfoDebugScope ||
                ext_inst_key == DebugInfoDebugNoScope ||
                ext_inst_key == DebugInfoDebugDeclare ||
                ext_inst_key == DebugInfoDebugValue) {
              local_debug_info = true;
            }
          }

          if (local_debug_info) {
            if (_.in_function_body() == false) {
              // DebugScope, DebugNoScope, DebugDeclare, DebugValue must
              // appear in a function body.
              return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                     << "DebugScope, DebugNoScope, DebugDeclare, DebugValue "
                     << "of debug info extension must appear in a function "
                     << "body";
            }
          } else {
            // Debug info extinst opcodes other than DebugScope, DebugNoScope,
            // DebugDeclare, DebugValue must be placed between section 9 (types,
            // constants, global variables) and section 10 (function
            // declarations).
            if (_.current_layout_section() < kLayoutTypes ||
                _.current_layout_section() >= kLayoutFunctionDeclarations) {
              return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                     << "Debug info extension instructions other than "
                     << "DebugScope, DebugNoScope, DebugDeclare, DebugValue "
                     << "must appear between section 9 (types, constants, "
                     << "global variables) and section 10 (function "
                     << "declarations)";
            }
          }
        } else if (spvExtInstIsNonSemantic(inst->ext_inst_type())) {
          // non-semantic extinst opcodes are allowed beginning in the types
          // section, but must either be placed outside a function declaration,
          // or inside a block.
          if (_.current_layout_section() < kLayoutTypes) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << "Non-semantic OpExtInst must not appear before types "
                   << "section";
          } else if (_.in_function_body() && _.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << "Non-semantic OpExtInst within function definition must "
                      "appear in a block";
          }
        } else {
          // otherwise they must be used in a block
          if (_.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << spvOpcodeString(opcode) << " must appear in a block";
          }
        }
        break;

      default:
        if (_.current_layout_section() == kLayoutFunctionDeclarations &&
            _.in_function_body()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "A function must begin with a label";
        } else {
          if (_.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << spvOpcodeString(opcode) << " must appear in a block";
          }
        }
        break;
    }
  } else {
    return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
           << spvOpcodeString(opcode)
           << " cannot appear in a function declaration";
  }
  return SPV_SUCCESS;
}